

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O1

bool __thiscall
ObjectModelBuilder::buildMaybeSignal(ObjectModelBuilder *this,value *value,Class *clazz)

{
  bool bVar1;
  ostream *poVar2;
  string local_40;
  
  if (value->type_ == 3) {
    string_trim(&local_40,(value->u_).string_);
    bVar1 = buildSignal(this,&local_40,clazz);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: signal in class=\'",0x18);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(clazz->name)._M_dataplus._M_p,
                        (clazz->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' is not a JSON string..",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ObjectModelBuilder::buildMaybeSignal(const picojson::value &value, Class *clazz)
{
    if (!value.is<std::string>()) {
        std::cerr << "error: signal in class='" << clazz->name << "' is not a JSON string.." << std::endl;
        return false;
    }
    return buildSignal(string_trim(value.get<std::string>()), clazz);
}